

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TraceConfig_ProducerConfig::TraceConfig_ProducerConfig
          (TraceConfig_ProducerConfig *this,TraceConfig_ProducerConfig *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_ProducerConfig_003c7c10;
  paVar1 = &(this->producer_name_).field_2;
  (this->producer_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->producer_name_)._M_dataplus._M_p;
  paVar2 = &(param_2->producer_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->producer_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->producer_name_).field_2 + 8) = uVar4;
  }
  else {
    (this->producer_name_)._M_dataplus._M_p = pcVar3;
    (this->producer_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->producer_name_)._M_string_length = (param_2->producer_name_)._M_string_length;
  (param_2->producer_name_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->producer_name_)._M_string_length = 0;
  (param_2->producer_name_).field_2._M_local_buf[0] = '\0';
  uVar5 = param_2->page_size_kb_;
  this->shm_size_kb_ = param_2->shm_size_kb_;
  this->page_size_kb_ = uVar5;
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->unknown_fields_)._M_dataplus._M_p;
  paVar2 = &(param_2->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar4;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar3;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_2->unknown_fields_)._M_string_length;
  (param_2->unknown_fields_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->unknown_fields_)._M_string_length = 0;
  (param_2->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_2->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TraceConfig_ProducerConfig::TraceConfig_ProducerConfig(TraceConfig_ProducerConfig&&) noexcept = default;